

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

void __thiscall tinyusdz::Prim::Prim(Prim *this,string *elementPath,Value *rhs)

{
  Value *pVVar1;
  uint32_t uVar2;
  allocator local_209;
  string local_208;
  Path local_1e8;
  allocator local_111;
  string local_110;
  Path local_f0;
  Value *local_20;
  Value *rhs_local;
  string *elementPath_local;
  Prim *this_local;
  
  local_20 = rhs;
  rhs_local = (Value *)elementPath;
  elementPath_local = (string *)this;
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  std::__cxx11::string::string((string *)&this->_prim_type_name);
  this->_specifier = Invalid;
  tinyusdz::value::Value::Value(&this->_data);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::vector(&this->_children);
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::multiset(&this->_childrenNameSet);
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  std::vector<long,_std::allocator<long>_>::vector(&this->_primChildrenIndices);
  this->_prim_id = -1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::map(&this->_variantSets);
  uVar2 = tinyusdz::value::Value::type_id(local_20);
  if ((0x3ff < uVar2) &&
     (uVar2 = tinyusdz::value::Value::type_id(local_20), pVVar1 = rhs_local, uVar2 < 0x2006)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"",&local_111);
    Path::Path(&local_f0,(string *)pVVar1,&local_110);
    Path::operator=(&this->_path,&local_f0);
    Path::~Path(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pVVar1 = rhs_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"",&local_209);
    Path::Path(&local_1e8,(string *)pVVar1,&local_208);
    Path::operator=(&this->_elementPath,&local_1e8);
    Path::~Path(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    tinyusdz::value::Value::operator=(&this->_data,local_20);
    SetPrimElementName(&this->_data,(string *)rhs_local);
  }
  return;
}

Assistant:

Prim::Prim(const std::string &elementPath, value::Value &&rhs) {
  // Check if type is Prim(Model(GPrim), usdShade, usdLux, etc.)
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= rhs.type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > rhs.type_id())) {
    _path = Path(elementPath, /* prop part */ "");
    _elementPath = Path(elementPath, /* prop part */ "");

    _data = std::move(rhs);
    SetPrimElementName(_data, elementPath);
  } else {
    // TODO: Raise an error if rhs is not an Prim
  }
}